

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_track.cpp
# Opt level: O1

void __thiscall cp::CoMTrack::calcRefZMP(CoMTrack *this,Vector2 *end_cp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  *(double *)(this + 0x30) = *(double *)(this + 0x18);
  *(undefined8 *)(this + 0x38) = *(undefined8 *)this;
  *(double *)(this + 0x40) = *(double *)(this + 0x28);
  dVar1 = exp(*(double *)(this + 0x18) * *(double *)(this + 0x28));
  dVar2 = exp(*(double *)(this + 0x30) * *(double *)(this + 0x40));
  dVar3 = (*(double *)(this + 0x60) - *(double *)(this + 0x70)) * dVar2 + *(double *)(this + 0x70);
  dVar2 = (*(double *)(this + 0x68) - *(double *)(this + 0x78)) * dVar2 + *(double *)(this + 0x78);
  *(double *)(this + 0x60) = dVar3;
  *(double *)(this + 0x68) = dVar2;
  auVar4._0_8_ = (end_cp->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[0] - dVar1 * dVar3;
  auVar4._8_8_ = (end_cp->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[1] - dVar1 * dVar2;
  auVar5._8_8_ = 1.0 - dVar1;
  auVar5._0_8_ = 1.0 - dVar1;
  auVar5 = divpd(auVar4,auVar5);
  *(undefined1 (*) [16])(this + 0x70) = auVar5;
  return;
}

Assistant:

void CoMTrack::calcRefZMP(const Vector2& end_cp) {
  setStepVariable();
  double b = exp(w * st_s);
  now_cp = calcCPTrack(st_s);
  ref_zmp = (end_cp - b * now_cp) / (1 - b);
}